

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factory.cpp
# Opt level: O1

void __thiscall registerEntity::test_method(registerEntity *this)

{
  string *psVar1;
  undefined8 **local_120;
  undefined1 local_118;
  undefined8 *local_110;
  char *local_108;
  undefined1 local_f8;
  undefined8 local_f0;
  shared_count asStack_e8 [9];
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  char *local_50;
  char *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  char *local_30;
  char *local_28;
  
  psVar1 = (string *)dynamicgraph::FactoryStorage::getInstance();
  local_120 = &local_110;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"myEntity","");
  dynamicgraph::FactoryStorage::registerEntity(psVar1,(_func_Entity_ptr_string_ptr *)&local_120);
  if (local_120 != &local_110) {
    operator_delete(local_120,(long)local_110 + 1);
  }
  psVar1 = (string *)dynamicgraph::FactoryStorage::getInstance();
  local_120 = &local_110;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"myEntity","");
  dynamicgraph::FactoryStorage::registerEntity(psVar1,(_func_Entity_ptr_string_ptr *)&local_120);
  if (local_120 != &local_110) {
    operator_delete(local_120,(long)local_110 + 1);
  }
  local_30 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/factory.cpp"
  ;
  local_28 = "";
  local_40 = &boost::unit_test::basic_cstring<char_const>::null;
  local_38 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_30,0x2e);
  local_f8 = 0;
  local_f0 = 0;
  asStack_e8[0].pi_ = (sp_counted_base *)0x0;
  local_118 = 0;
  local_120 = (undefined8 **)&PTR__lazy_ostream_0010cb18;
  local_110 = &boost::unit_test::lazy_ostream::inst;
  local_108 = "Should never happen.";
  local_50 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/factory.cpp"
  ;
  local_48 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(asStack_e8);
  psVar1 = (string *)dynamicgraph::FactoryStorage::getInstance();
  local_120 = &local_110;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"myEntity","");
  dynamicgraph::FactoryStorage::registerEntity(psVar1,(_func_Entity_ptr_string_ptr *)&local_120);
  if (local_120 != &local_110) {
    operator_delete(local_120,(long)local_110 + 1);
  }
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/factory.cpp"
  ;
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x36);
  local_f8 = 0;
  local_f0 = 0;
  asStack_e8[0].pi_ = (sp_counted_base *)0x0;
  local_118 = 0;
  local_120 = (undefined8 **)&PTR__lazy_ostream_0010cb18;
  local_110 = &boost::unit_test::lazy_ostream::inst;
  local_108 = "Should never happen.";
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/factory.cpp"
  ;
  local_98 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(asStack_e8);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(registerEntity) {
  dynamicgraph::FactoryStorage::getInstance()->registerEntity("myEntity",
                                                              &makeEntity);

  try {
    dynamicgraph::FactoryStorage::getInstance()->registerEntity("myEntity",
                                                                &makeEntity);
    BOOST_ERROR("Should never happen.");
  } catch (const dynamicgraph::ExceptionFactory &exception) {
    BOOST_CHECK_EQUAL(exception.getCode(),
                      dynamicgraph::ExceptionFactory::OBJECT_CONFLICT);
  }

  try {
    dynamicgraph::FactoryStorage::getInstance()->registerEntity("myEntity", 0);
    BOOST_ERROR("Should never happen.");
  } catch (const dynamicgraph::ExceptionFactory &exception) {
    BOOST_CHECK_EQUAL(exception.getCode(),
                      dynamicgraph::ExceptionFactory::OBJECT_CONFLICT);
  }
}